

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q3.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string str;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"this is a string",(allocator<char> *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68," ",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"%20",&local_6a);
  replace(&str,&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&str);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&str);
  return 0;
}

Assistant:

int main(){
  std::string str {"this is a string"};

  replace(str, " ", "%20");

  std::cout << str << '\n';
  
  return 0;
}